

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O2

bool __thiscall
duckdb::WindowMergeSortTree::TryPrepareSortStage
          (WindowMergeSortTree *this,WindowMergeSortTreeLocalState *lstate)

{
  GlobalSortStatePtr *pGVar1;
  ulong uVar2;
  pointer pGVar3;
  bool bVar4;
  
  ::std::mutex::lock(&this->lock);
  switch((this->build_stage)._M_i) {
  case INIT:
    this->total_tasks =
         (long)(this->local_sorts).
               super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->local_sorts).
               super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    this->tasks_assigned = 0;
    LOCK();
    (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    bVar4 = true;
    LOCK();
    (this->build_stage)._M_i = SCAN;
    UNLOCK();
    lstate->build_stage = SCAN;
    this->tasks_assigned = 1;
    lstate->build_task = 0;
    goto LAB_015c00e7;
  case SCAN:
    uVar2 = this->tasks_assigned;
    if (this->total_tasks <= uVar2) {
      if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned) {
LAB_015c00c9:
        bVar4 = false;
        goto LAB_015c00e7;
      }
      pGVar1 = &this->global_sort;
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      GlobalSortState::PrepareMergePhase(pGVar3);
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if (8 < (ulong)((long)(pGVar3->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar3->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator->(pGVar1);
        GlobalSortState::InitializeMergeRound(pGVar3);
        LOCK();
        (this->build_stage)._M_i = MERGE;
        UNLOCK();
LAB_015c0122:
        lstate->build_stage = MERGE;
        this->total_tasks =
             (long)(this->local_sorts).
                   super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->local_sorts).
                   super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
        this->tasks_assigned = 1;
        LOCK();
        (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        break;
      }
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if ((pGVar3->sorted_blocks).
          super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pGVar3->sorted_blocks).
          super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (*this->_vptr_WindowMergeSortTree[4])(this);
        goto LAB_015c0061;
      }
      goto switchD_015bfedb_caseD_2;
    }
    lstate->build_stage = SCAN;
LAB_015bff8b:
    this->tasks_assigned = uVar2 + 1;
    lstate->build_task = uVar2;
    break;
  case MERGE:
    uVar2 = this->tasks_assigned;
    if (uVar2 < this->total_tasks) {
      lstate->build_stage = MERGE;
      this->tasks_assigned = uVar2 + 1;
    }
    else {
      if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned)
      goto LAB_015c00c9;
      pGVar1 = &this->global_sort;
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      GlobalSortState::CompleteMergeRound(pGVar3,true);
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if (8 < (ulong)((long)(pGVar3->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar3->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator->(pGVar1);
        GlobalSortState::InitializeMergeRound(pGVar3);
        goto LAB_015c0122;
      }
      (*this->_vptr_WindowMergeSortTree[4])(this);
LAB_015c0061:
      this->total_tasks =
           ((long)(this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) - 1;
      LOCK();
      (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      this->tasks_assigned = 0;
      LOCK();
      (this->build_stage)._M_i = SORTED;
      UNLOCK();
      lstate->build_stage = SORTED;
      this->tasks_assigned = 1;
      lstate->build_task = 0;
    }
    break;
  case SORTED:
    uVar2 = this->tasks_assigned;
    if (uVar2 < this->total_tasks) {
      lstate->build_stage = SORTED;
      goto LAB_015bff8b;
    }
    if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned) {
      lstate->build_stage = FINISHED;
      goto LAB_015c00c9;
    }
    (*this->_vptr_WindowMergeSortTree[3])(this);
  default:
switchD_015bfedb_caseD_2:
    LOCK();
    (this->build_stage)._M_i = FINISHED;
    UNLOCK();
    lstate->build_stage = FINISHED;
  }
  bVar4 = true;
LAB_015c00e7:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return bVar4;
}

Assistant:

bool WindowMergeSortTree::TryPrepareSortStage(WindowMergeSortTreeLocalState &lstate) {
	lock_guard<mutex> stage_guard(lock);

	switch (build_stage.load()) {
	case PartitionSortStage::INIT:
		total_tasks = local_sorts.size();
		tasks_assigned = 0;
		tasks_completed = 0;
		lstate.build_stage = build_stage = PartitionSortStage::SCAN;
		lstate.build_task = tasks_assigned++;
		return true;
	case PartitionSortStage::SCAN:
		// Process all the local sorts
		if (tasks_assigned < total_tasks) {
			lstate.build_stage = PartitionSortStage::SCAN;
			lstate.build_task = tasks_assigned++;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			return false;
		}
		global_sort->PrepareMergePhase();
		if (!(global_sort->sorted_blocks.size() / 2)) {
			if (global_sort->sorted_blocks.empty()) {
				lstate.build_stage = build_stage = PartitionSortStage::FINISHED;
				return true;
			}
			MeasurePayloadBlocks();
			total_tasks = block_starts.size() - 1;
			tasks_completed = 0;
			tasks_assigned = 0;
			lstate.build_stage = build_stage = PartitionSortStage::SORTED;
			lstate.build_task = tasks_assigned++;
			return true;
		}
		global_sort->InitializeMergeRound();
		lstate.build_stage = build_stage = PartitionSortStage::MERGE;
		total_tasks = local_sorts.size();
		tasks_assigned = 1;
		tasks_completed = 0;
		return true;
	case PartitionSortStage::MERGE:
		if (tasks_assigned < total_tasks) {
			lstate.build_stage = PartitionSortStage::MERGE;
			++tasks_assigned;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			return false;
		}
		global_sort->CompleteMergeRound(true);
		if (!(global_sort->sorted_blocks.size() / 2)) {
			MeasurePayloadBlocks();
			total_tasks = block_starts.size() - 1;
			tasks_completed = 0;
			tasks_assigned = 0;
			lstate.build_stage = build_stage = PartitionSortStage::SORTED;
			lstate.build_task = tasks_assigned++;
			return true;
		}
		global_sort->InitializeMergeRound();
		lstate.build_stage = PartitionSortStage::MERGE;
		total_tasks = local_sorts.size();
		tasks_assigned = 1;
		tasks_completed = 0;
		return true;
	case PartitionSortStage::SORTED:
		if (tasks_assigned < total_tasks) {
			lstate.build_stage = PartitionSortStage::SORTED;
			lstate.build_task = tasks_assigned++;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			lstate.build_stage = PartitionSortStage::FINISHED;
			// Sleep while other tasks finish
			return false;
		}
		CleanupSort();
		break;
	default:
		break;
	}

	lstate.build_stage = build_stage = PartitionSortStage::FINISHED;

	return true;
}